

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O0

void qDrawPlainRect(QPainter *p,QRect *r,QColor *c,int lineWidth,QBrush *fill)

{
  int iVar1;
  int h;
  int w;
  undefined4 in_ECX;
  undefined8 in_R8;
  int in_stack_000000a0;
  QBrush *in_stack_000000a8;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = QRect::x((QRect *)0x3fa974);
  h = QRect::y((QRect *)0x3fa982);
  w = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  qDrawPlainRect((QPainter *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int)((ulong)in_R8 >> 0x20),
                 (int)in_R8,w,h,(QColor *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                 in_stack_000000a0,in_stack_000000a8);
  return;
}

Assistant:

void qDrawPlainRect(QPainter *p, const QRect &r, const QColor &c,
                     int lineWidth, const QBrush *fill)
{
    qDrawPlainRect(p, r.x(), r.y(), r.width(), r.height(), c,
                    lineWidth, fill);
}